

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<kj::AutoCloseFd> __thiscall
kj::_::
TransformPromiseNode<kj::Promise<kj::AutoCloseFd>,_kj::Maybe<kj::AutoCloseFd>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:1834:30),_kj::_::PropagateException>
::anon_class_1_0_00000001_for_func::operator()
          (anon_class_1_0_00000001_for_func *this,Maybe<kj::AutoCloseFd> *result)

{
  char (*in_RCX) [41];
  char *in_RDX;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar1;
  Promise<kj::AutoCloseFd> PVar2;
  AutoCloseFd local_190;
  Array<char> local_188;
  Exception local_170;
  
  if (*in_RDX == '\x01') {
    AutoCloseFd::AutoCloseFd(&local_190,(AutoCloseFd *)(in_RDX + 4));
    Promise<kj::AutoCloseFd>::Promise((Promise<kj::AutoCloseFd> *)this,&local_190);
    AutoCloseFd::~AutoCloseFd(&local_190);
    pPVar1 = extraout_RDX;
  }
  else {
    Debug::makeDescription<char_const(&)[41]>
              ((String *)&local_188,(Debug *)"\"EOF when expecting to receive capability\"",
               "EOF when expecting to receive capability",in_RCX);
    Exception::Exception
              (&local_170,FAILED,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x72e,(String *)&local_188);
    Promise<kj::AutoCloseFd>::Promise((Promise<kj::AutoCloseFd> *)this,&local_170);
    Exception::~Exception(&local_170);
    Array<char>::~Array(&local_188);
    pPVar1 = extraout_RDX_00;
  }
  PVar2.super_PromiseBase.node.ptr = pPVar1;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::AutoCloseFd>)PVar2.super_PromiseBase.node;
}

Assistant:

Promise<AutoCloseFd> AsyncCapabilityStream::receiveFd() {
  return tryReceiveFd().then([](Maybe<AutoCloseFd>&& result) -> Promise<AutoCloseFd> {
    KJ_IF_MAYBE(r, result) {
      return kj::mv(*r);
    } else {
      return KJ_EXCEPTION(FAILED, "EOF when expecting to receive capability");
    }
  });
}